

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svglayoutstate.cpp
# Opt level: O3

Font __thiscall lunasvg::SVGLayoutState::font(SVGLayoutState *this)

{
  char cVar1;
  char cVar2;
  FontFace FVar3;
  char *pcVar4;
  void *pvVar5;
  ulong uVar6;
  string_view *psVar7;
  ulong uVar8;
  char *__s;
  byte *pbVar9;
  long lVar10;
  long in_RSI;
  char *pcVar11;
  char *pcVar12;
  size_type __n;
  ulong __n_00;
  undefined8 extraout_XMM0_Qa;
  Font FVar13;
  FontFace face;
  basic_string_view<char,_std::char_traits<char>_> family;
  FontFace local_60;
  ulong local_58;
  char *local_50;
  FontFace local_48;
  long local_40;
  FontFace local_38;
  
  cVar1 = *(char *)(in_RSI + 0xbc);
  local_60.m_face = (plutovg_font_face_t *)0x0;
  __n_00 = *(ulong *)(in_RSI + 0x170);
  local_40 = in_RSI;
  local_38.m_face = (plutovg_font_face_t *)this;
  if (__n_00 != 0) {
    __s = *(char **)(in_RSI + 0x168);
LAB_00116475:
    if (local_60.m_face == (plutovg_font_face_t *)0x0) {
      pvVar5 = memchr(__s,0x2c,__n_00);
      uVar8 = -(ulong)(pvVar5 == (void *)0x0) | (long)pvVar5 - (long)__s;
      uVar6 = uVar8;
      if (__n_00 < uVar8) {
        uVar6 = __n_00;
      }
      pcVar12 = __s + uVar6;
      __n_00 = __n_00 - uVar6;
      if (__n_00 == 0) {
        __n_00 = 0;
      }
      else if (*pcVar12 == ',') {
        pcVar12 = pcVar12 + 1;
        __n_00 = __n_00 - 1;
      }
      local_58 = uVar6;
      local_50 = __s;
      if (uVar8 == 0) {
LAB_00116522:
        if ((uVar6 != 0) && ((cVar2 = *__s, cVar2 == '\'' || (cVar2 == '\"')))) {
          local_50 = __s + 1;
          uVar8 = uVar6 - 1;
          local_58 = uVar8;
          if ((uVar8 != 0) &&
             ((__s[uVar6 - 1] != cVar2 || (uVar8 = uVar6 - 2, local_58 = uVar8, uVar8 != 0)))) {
            pcVar4 = __s + 2;
            uVar6 = uVar8;
            local_58 = uVar8;
            do {
              pcVar11 = pcVar4;
              uVar6 = uVar6 - 1;
              if ((0x20 < (ulong)(byte)pcVar11[-1]) ||
                 ((0x100002600U >> ((ulong)(byte)pcVar11[-1] & 0x3f) & 1) == 0)) {
                pbVar9 = (byte *)(__s + uVar8);
                goto LAB_00116620;
              }
              local_58 = local_58 - 1;
              pcVar4 = pcVar11 + 1;
              local_50 = pcVar11;
            } while (local_58 != 0);
          }
        }
      }
      else {
        lVar10 = -1;
        uVar8 = 0;
        do {
          if ((0x20 < (ulong)(byte)__s[uVar8]) ||
             ((0x100002600U >> ((ulong)(byte)__s[uVar8] & 0x3f) & 1) == 0)) {
            goto LAB_001165a6;
          }
          local_50 = __s + uVar8 + 1;
          local_58 = uVar6 + lVar10;
          uVar8 = uVar8 + 1;
          lVar10 = lVar10 + -1;
        } while (uVar6 != uVar8);
      }
      goto LAB_001165c8;
    }
    goto LAB_001166a1;
  }
LAB_00116647:
  psVar7 = (string_view *)fontFaceCache();
  local_58 = DAT_0015c368;
  local_50 = emptyString_abi_cxx11_;
  FontFaceCache::getFontFace((FontFaceCache *)&local_48,psVar7,SUB81(&local_58,0),cVar1 == '\x01');
  FontFace::operator=(&local_60,&local_48);
  FontFace::~FontFace(&local_48);
LAB_001166a1:
  FVar3.m_face = local_38.m_face;
  Font::Font((Font *)local_38.m_face,&local_60,*(float *)(local_40 + 0x7c));
  FontFace::~FontFace(&local_60);
  FVar13._8_8_ = extraout_XMM0_Qa;
  FVar13.m_face.m_face = FVar3.m_face;
  return FVar13;
  while( true ) {
    local_58 = lVar10 + uVar6;
    uVar6 = uVar6 - 1;
    if (uVar8 == uVar6) break;
LAB_001165a6:
    if ((0x20 < (ulong)(byte)__s[uVar6 - 1]) ||
       ((0x100002600U >> ((ulong)(byte)__s[uVar6 - 1] & 0x3f) & 1) == 0)) {
      uVar6 = uVar6 - uVar8;
      __s = __s + uVar8;
      goto LAB_00116522;
    }
  }
  goto LAB_001165c8;
  while( true ) {
    pbVar9 = pbVar9 + -1;
    uVar6 = uVar8 - 1;
    local_58 = uVar8;
    if (uVar8 == 0) break;
LAB_00116620:
    uVar8 = uVar6;
    if ((0x20 < (ulong)*pbVar9) || ((0x100002600U >> ((ulong)*pbVar9 & 0x3f) & 1) == 0)) break;
  }
LAB_001165c8:
  psVar7 = (string_view *)fontFaceCache();
  FontFaceCache::getFontFace((FontFaceCache *)&local_48,psVar7,SUB81(&local_58,0),cVar1 == '\x01');
  FontFace::operator=(&local_60,&local_48);
  FontFace::~FontFace(&local_48);
  __s = pcVar12;
  if (__n_00 == 0) goto LAB_0011663f;
  goto LAB_00116475;
LAB_0011663f:
  if (local_60.m_face != (plutovg_font_face_t *)0x0) goto LAB_001166a1;
  goto LAB_00116647;
}

Assistant:

Font SVGLayoutState::font() const
{
    auto bold = m_font_weight == FontWeight::Bold;
    auto italic = m_font_style == FontStyle::Italic;

    FontFace face;
    std::string_view input(m_font_family);
    while(!input.empty() && face.isNull()) {
        auto family = input.substr(0, input.find(','));
        input.remove_prefix(family.length());
        if(!input.empty() && input.front() == ',')
            input.remove_prefix(1);
        stripLeadingAndTrailingSpaces(family);
        if(!family.empty() && (family.front() == '\'' || family.front() == '"')) {
            auto quote = family.front();
            family.remove_prefix(1);
            if(!family.empty() && family.back() == quote)
                family.remove_suffix(1);
            stripLeadingAndTrailingSpaces(family);
        }

        face = fontFaceCache()->getFontFace(family, bold, italic);
    }

    if(face.isNull())
        face = fontFaceCache()->getFontFace(emptyString, bold, italic);
    return Font(face, m_font_size);
}